

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

float __thiscall CUI::DoScrollbarV(CUI *this,void *pID,CUIRect *pRect,float Current)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  void *pvVar5;
  void *in_RSI;
  CUI *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar6;
  float Cur;
  float Max;
  float Min;
  float ReturnValue;
  bool Grabbed;
  bool InsideRail;
  bool InsideHandle;
  CUIRect Handle;
  CUIRect Rail;
  CUIRect *in_stack_ffffffffffffff68;
  int Index;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined2 uVar7;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float local_6c;
  bool local_67;
  vector4_base<float> local_38;
  int in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float local_10;
  float local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c = clamp<float>(in_XMM0_Da,0.0,1.0);
  CUIRect::VMargin((CUIRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  clamp<float>(33.0,local_10,local_c / 3.0);
  CUIRect::HSplitTop((CUIRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,(CUIRect *)0x1dd762);
  Index = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  in_stack_ffffffffffffffdc =
       (local_c - in_stack_ffffffffffffffe4) * local_6c + in_stack_ffffffffffffffdc;
  bVar2 = MouseHovered(in_RDI,(CUIRect *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar3 = MouseHovered(in_RDI,(CUIRect *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_67 = false;
  bVar4 = CheckActiveItem(in_RDI,in_RSI);
  if (bVar4) {
    local_67 = MouseButton(in_RDI,0);
    if (!local_67) {
      SetActiveItem(in_RDI,(void *)0x0);
    }
  }
  else {
    pvVar5 = HotItem(in_RDI);
    if (pvVar5 == in_RSI) {
      local_67 = MouseButton(in_RDI,0);
      if (local_67) {
        fVar6 = MouseY(in_RDI);
        DoScrollbarV::s_OffsetY = fVar6 - in_stack_ffffffffffffffdc;
        SetActiveItem(in_RDI,in_RSI);
      }
    }
    else {
      bVar4 = MouseButtonClicked((CUI *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),Index);
      if (((bVar4) && (!bVar2)) && (bVar3)) {
        DoScrollbarV::s_OffsetY = in_stack_ffffffffffffffe4 / 2.0;
        SetActiveItem(in_RDI,in_RSI);
        local_67 = true;
      }
    }
  }
  if (bVar2) {
    SetHotItem(in_RDI,in_RSI);
  }
  fVar6 = in_stack_ffffffffffffffec;
  if (local_67 != false) {
    in_stack_ffffffffffffff8c = local_c - in_stack_ffffffffffffffe4;
    in_stack_ffffffffffffff88 = MouseY(in_RDI);
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 - DoScrollbarV::s_OffsetY;
    local_6c = clamp<float>((in_stack_ffffffffffffff88 - in_stack_ffffffffffffffec) /
                            in_stack_ffffffffffffff8c,0.0,1.0);
  }
  uVar7 = (undefined2)((ulong)in_RDI >> 0x30);
  vector4_base<float>::vector4_base(&local_38,1.0,1.0,1.0,0.25);
  CUIRect::Draw((CUIRect *)CONCAT44(fVar6,in_stack_ffffffffffffffe8),
                (vec4 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  CScrollBarColorFunction::GetColor
            ((CScrollBarColorFunction *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
  CUIRect::Draw((CUIRect *)CONCAT44(fVar6,in_stack_ffffffffffffffe8),
                (vec4 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_6c;
}

Assistant:

float CUI::DoScrollbarV(const void *pID, const CUIRect *pRect, float Current)
{
	Current = clamp(Current, 0.0f, 1.0f);

	// layout
	CUIRect Rail;
	pRect->VMargin(5.0f, &Rail);

	CUIRect Handle;
	Rail.HSplitTop(clamp(33.0f, Rail.w, Rail.h / 3.0f), &Handle, 0);
	Handle.y += (Rail.h - Handle.h) * Current;

	// logic
	static float s_OffsetY;
	const bool InsideHandle = MouseHovered(&Handle);
	const bool InsideRail = MouseHovered(&Rail);
	bool Grabbed = false; // whether to apply the offset

	if(CheckActiveItem(pID))
	{
		if(MouseButton(0))
			Grabbed = true;
		else
			SetActiveItem(0);
	}
	else if(HotItem() == pID)
	{
		if(MouseButton(0))
		{
			s_OffsetY = MouseY() - Handle.y;
			SetActiveItem(pID);
			Grabbed = true;
		}
	}
	else if(MouseButtonClicked(0) && !InsideHandle && InsideRail)
	{
		s_OffsetY = Handle.h / 2.0f;
		SetActiveItem(pID);
		Grabbed = true;
	}

	if(InsideHandle)
	{
		SetHotItem(pID);
	}

	float ReturnValue = Current;
	if(Grabbed)
	{
		const float Min = Rail.y;
		const float Max = Rail.h - Handle.h;
		const float Cur = MouseY() - s_OffsetY;
		ReturnValue = clamp((Cur - Min) / Max, 0.0f, 1.0f);
	}

	// render
	Rail.Draw(vec4(1.0f, 1.0f, 1.0f, 0.25f), Rail.w / 2.0f);
	Handle.Draw(ScrollBarColorFunction.GetColor(Grabbed, InsideHandle), Handle.w / 2.0f);

	return ReturnValue;
}